

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

uint32_t __thiscall cfd::TransactionController::GetSizeIgnoreTxIn(TransactionController *this)

{
  bool bVar1;
  uint32_t uVar2;
  AbstractTxOutReference *this_00;
  long in_RDI;
  TxOutReference *txout;
  iterator __end1;
  iterator __begin1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *__range1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> txouts;
  uint32_t result;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  local_40;
  __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  local_38;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *local_30;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_28;
  uint32_t local_c;
  
  local_c = 10;
  core::Transaction::GetTxOutList(&local_28,(Transaction *)(in_RDI + 0x10));
  local_30 = &local_28;
  local_38._M_current =
       (TxOutReference *)
       std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::begin
                 (local_30);
  local_40._M_current =
       (TxOutReference *)
       std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::end
                 (local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    uVar2 = local_c;
    if (!bVar1) break;
    this_00 = &__gnu_cxx::
               __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
               ::operator*(&local_38)->super_AbstractTxOutReference;
    uVar2 = core::AbstractTxOutReference::GetSerializeSize(this_00);
    local_c = uVar2 + local_c;
    __gnu_cxx::
    __normal_iterator<cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
    ::operator++(&local_38);
  }
  std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
            (in_stack_ffffffffffffffb0);
  return uVar2;
}

Assistant:

uint32_t TransactionController::GetSizeIgnoreTxIn() const {
  uint32_t result = AbstractTransaction::kTransactionMinimumSize;
  std::vector<TxOutReference> txouts = transaction_.GetTxOutList();
  for (const auto& txout : txouts) {
    result += txout.GetSerializeSize();
  }
  return result;
}